

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  _Bool _Var1;
  size_t sVar2;
  uint32_t in_stack_0000029c;
  size_t in_stack_000002a0;
  uint32_t *in_stack_000002a8;
  size_t in_stack_000002b0;
  uint64_t *in_stack_000002b8;
  uint32_t base_local;
  bitset_container_t *bc_local;
  uint32_t *out_local;
  
  _Var1 = croaring_avx2();
  if ((_Var1) && (0x1fff < bc->cardinality)) {
    sVar2 = bitset_extract_setbits_avx2
                      (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
                       in_stack_0000029c);
    out_local._4_4_ = (int)sVar2;
  }
  else {
    sVar2 = bitset_extract_setbits(bc->words,0x400,out,base);
    out_local._4_4_ = (int)sVar2;
  }
  return out_local._4_4_;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#ifdef CROARING_IS_X64
    if(( croaring_avx2() ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}